

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btSoftRigidDynamicsWorld::btSoftRigidDynamicsWorld
          (btSoftRigidDynamicsWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btConstraintSolver *constraintSolver,btCollisionConfiguration *collisionConfiguration,
          btSoftBodySolver *softBodySolver)

{
  btSparseSdf<3> *this_00;
  btDefaultSoftBodySolver *this_01;
  
  btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
            (&this->super_btDiscreteDynamicsWorld,dispatcher,pairCache,constraintSolver,
             collisionConfiguration);
  (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
  _vptr_btCollisionWorld = (_func_int **)&PTR__btSoftRigidDynamicsWorld_001f2af0;
  (this->m_softBodies).m_ownsMemory = true;
  (this->m_softBodies).m_data = (btSoftBody **)0x0;
  (this->m_softBodies).m_size = 0;
  (this->m_softBodies).m_capacity = 0;
  btSoftBodyWorldInfo::btSoftBodyWorldInfo(&this->m_sbi);
  this->m_softBodySolver = softBodySolver;
  this->m_ownsSolver = false;
  if (softBodySolver == (btSoftBodySolver *)0x0) {
    this_01 = (btDefaultSoftBodySolver *)btAlignedAllocInternal(0x38,0x10);
    btDefaultSoftBodySolver::btDefaultSoftBodySolver(this_01);
    this->m_softBodySolver = (btSoftBodySolver *)this_01;
    this->m_ownsSolver = true;
  }
  this->m_drawFlags = 0x10ce;
  this->m_drawNodeTree = true;
  this->m_drawFaceTree = false;
  this->m_drawClusterTree = false;
  (this->m_sbi).m_broadphase = pairCache;
  (this->m_sbi).m_dispatcher = dispatcher;
  this_00 = &(this->m_sbi).m_sparsesdf;
  btSparseSdf<3>::Initialize(this_00,0x94f,0x40000);
  btSparseSdf<3>::Reset(this_00);
  (this->m_sbi).air_density = 1.2;
  (this->m_sbi).water_density = 0.0;
  (this->m_sbi).water_offset = 0.0;
  (this->m_sbi).water_normal.m_floats[0] = 0.0;
  (this->m_sbi).water_normal.m_floats[1] = 0.0;
  (this->m_sbi).water_normal.m_floats[2] = 0.0;
  (this->m_sbi).water_normal.m_floats[3] = 0.0;
  (this->m_sbi).m_gravity.m_floats[0] = 0.0;
  (this->m_sbi).m_gravity.m_floats[1] = -10.0;
  (this->m_sbi).m_gravity.m_floats[2] = 0.0;
  (this->m_sbi).m_gravity.m_floats[3] = 0.0;
  btSparseSdf<3>::Initialize(this_00,0x94f,0x40000);
  return;
}

Assistant:

btSoftRigidDynamicsWorld::btSoftRigidDynamicsWorld(
	btDispatcher* dispatcher,
	btBroadphaseInterface* pairCache,
	btConstraintSolver* constraintSolver,
	btCollisionConfiguration* collisionConfiguration,
	btSoftBodySolver *softBodySolver ) : 
		btDiscreteDynamicsWorld(dispatcher,pairCache,constraintSolver,collisionConfiguration),
		m_softBodySolver( softBodySolver ),
		m_ownsSolver(false)
{
	if( !m_softBodySolver )
	{
		void* ptr = btAlignedAlloc(sizeof(btDefaultSoftBodySolver),16);
		m_softBodySolver = new(ptr) btDefaultSoftBodySolver();
		m_ownsSolver = true;
	}

	m_drawFlags			=	fDrawFlags::Std;
	m_drawNodeTree		=	true;
	m_drawFaceTree		=	false;
	m_drawClusterTree	=	false;
	m_sbi.m_broadphase = pairCache;
	m_sbi.m_dispatcher = dispatcher;
	m_sbi.m_sparsesdf.Initialize();
	m_sbi.m_sparsesdf.Reset();

	m_sbi.air_density		=	(btScalar)1.2;
	m_sbi.water_density	=	0;
	m_sbi.water_offset		=	0;
	m_sbi.water_normal		=	btVector3(0,0,0);
	m_sbi.m_gravity.setValue(0,-10,0);

	m_sbi.m_sparsesdf.Initialize();


}